

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O1

ZyanStatus
ZydisFormatterTokenizeInstruction
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count,void *buffer,ZyanUSize length,
          ZyanU64 runtime_address,ZydisFormatterTokenConst **token,void *user_data)

{
  void *pvVar1;
  ZyanStatus ZVar2;
  ZydisFormatterTokenConst *pZVar3;
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_a0;
  ZydisFormatterBuffer local_78;
  
  ZVar2 = 0x80100004;
  if (instruction != (ZydisDecodedInstruction *)0x0 && formatter != (ZydisFormatter *)0x0) {
    if (((((operand_count < 0xb) &&
          (operands != (ZydisDecodedOperand *)0x0 || operand_count == '\0')) &&
         (token != (ZydisFormatterTokenConst **)0x0)) && ((2 < length && (buffer != (void *)0x0))))
       && (instruction->operand_count_visible <= operand_count)) {
      *(undefined2 *)buffer = 0;
      pvVar1 = (void *)((long)buffer + 2);
      local_78.capacity = length - 2;
      local_78.is_token_list = '\x01';
      local_78.string.flags = '\x01';
      local_78.string.vector.allocator = (ZyanAllocator *)0x0;
      local_78.string.vector.growth_factor = '\x01';
      local_78.string.vector.shrink_threshold = '\0';
      local_78.string.vector.destructor = (ZyanMemberProcedure)0x0;
      local_78.string.vector.element_size = 1;
      local_78.string.vector.size = 1;
      *(undefined1 *)((long)buffer + 2) = 0;
      local_a0.runtime_address = runtime_address;
      local_a0.operand = (ZydisDecodedOperand *)0x0;
      local_a0.user_data = user_data;
      local_a0.instruction = instruction;
      local_a0.operands = operands;
      local_78.string.vector.capacity = local_78.capacity;
      local_78.string.vector.data = pvVar1;
      if (((formatter->func_pre_instruction == (ZydisFormatterFunc)0x0) ||
          (ZVar2 = (*formatter->func_pre_instruction)(formatter,&local_78,&local_a0),
          -1 < (int)ZVar2)) &&
         ((ZVar2 = (*formatter->func_format_instruction)(formatter,&local_78,&local_a0),
          -1 < (int)ZVar2 &&
          ((formatter->func_post_instruction == (ZydisFormatterFunc)0x0 ||
           (ZVar2 = (*formatter->func_post_instruction)(formatter,&local_78,&local_a0),
           -1 < (int)ZVar2)))))) {
        pZVar3 = (ZydisFormatterTokenConst *)((long)pvVar1 + (ulong)*(byte *)((long)buffer + 1));
        if ((ulong)*(byte *)((long)buffer + 1) == 0) {
          pZVar3 = (ZydisFormatterTokenConst *)buffer;
        }
        *token = pZVar3;
        ZVar2 = 0x100000;
      }
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeInstruction(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operands,
    ZyanU8 operand_count, void* buffer, ZyanUSize length, ZyanU64 runtime_address,
    ZydisFormatterTokenConst** token, void* user_data)
{
    if (!formatter || !instruction || (operand_count && !operands) ||
        (operand_count > ZYDIS_MAX_OPERAND_COUNT) || 
        (operand_count < instruction->operand_count_visible) || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterToken* first_token;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = operands;
    context.runtime_address = runtime_address;
    context.operand         = ZYAN_NULL;
    context.user_data       = user_data;

    if (formatter->func_pre_instruction)
    {
        ZYAN_CHECK(formatter->func_pre_instruction(formatter, &formatter_buffer, &context));
    }

    ZYAN_CHECK(formatter->func_format_instruction(formatter, &formatter_buffer, &context));

    if (formatter->func_post_instruction)
    {
        ZYAN_CHECK(formatter->func_post_instruction(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}